

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lite_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::LiteTest_AllLite47_Test<absl::lts_20250127::Cord>::TestBody
          (LiteTest_AllLite47_Test<absl::lts_20250127::Cord> *this)

{
  anon_union_24_1_493b367e_for_PackedFixed32_3 *this_00;
  bool bVar1;
  int iVar2;
  uint *puVar3;
  Nonnull<const_char_*> failure_msg;
  pointer *__ptr;
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> __ptr_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  pointer pcVar4;
  char *in_R9;
  pointer *__ptr_2;
  string_view data;
  PackedFixed32 packed;
  string serialized;
  NonPackedFixed32 non_packed;
  AssertHelper local_c8;
  Message local_c0;
  LogMessageData *local_b8;
  undefined1 local_b0 [8];
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  AssertHelper local_90;
  PackedFixed32 local_88;
  string local_60;
  undefined1 local_40 [40];
  
  proto2_unittest::NonPackedFixed32::NonPackedFixed32((NonPackedFixed32 *)local_40,(Arena *)0x0);
  RepeatedField<unsigned_int>::Add((RepeatedField<unsigned_int> *)(local_40 + 0x10),0x2a);
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_b0[0] = (internal)MessageLite::SerializeToString((MessageLite *)local_40,&local_60);
  local_a8._M_head_impl = (LogMessageData *)0x0;
  if (!(bool)local_b0[0]) {
    testing::Message::Message(&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_88,(internal *)local_b0,
               (AssertionResult *)"non_packed.SerializeToString(&serialized)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x45b,(char *)local_88.super_MessageLite._vptr_MessageLite);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if ((anon_union_24_1_493b367e_for_PackedFixed32_3 *)local_88.super_MessageLite._vptr_MessageLite
        != &local_88.field_0) {
      operator_delete(local_88.super_MessageLite._vptr_MessageLite,
                      CONCAT71(local_88.field_0._1_7_,local_88.field_0._0_1_) + 1);
    }
    if ((long *)CONCAT44(local_c0.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_c0.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_c0.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_c0.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
    if ((_Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
         )local_a8._M_head_impl != (LogMessageData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_a8._M_head_impl);
    }
    goto LAB_00181177;
  }
  proto2_unittest::PackedFixed32::PackedFixed32(&local_88,(Arena *)0x0);
  data._M_str = local_60._M_dataplus._M_p;
  data._M_len = local_60._M_string_length;
  bVar1 = MessageLite::ParseFromString(&local_88.super_MessageLite,data);
  local_c0.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ =
       CONCAT31(local_c0.ss_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._1_3_,bVar1);
  local_b8 = (LogMessageData *)0x0;
  if (bVar1) {
    local_c0.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = 1;
    this_00 = &local_88.field_0;
    local_c8.data_._0_4_ =
         internal::SooRep::size((SooRep *)&this_00->_impl_,(local_88.field_0._0_1_ & 4) == 0);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_b0,"1","packed.repeated_fixed32_size()",(int *)&local_c0,
               (int *)&local_c8);
    if (local_b0[0] == (internal)0x0) {
      testing::Message::Message(&local_c0);
      if (local_a8._M_head_impl == (LogMessageData *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (pointer)((local_a8._M_head_impl)->entry).full_filename_._M_len;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
                 ,0x45f,pcVar4);
      testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if ((long *)CONCAT44(local_c0.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,
                           local_c0.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_c0.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_,
                                       local_c0.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._0_4_) + 8))();
      }
      if (local_a8._M_head_impl != (LogMessageData *)0x0) {
        this_01 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_a8;
        __ptr_00._M_head_impl = local_a8._M_head_impl;
        goto LAB_00181168;
      }
    }
    else {
      if (local_a8._M_head_impl != (LogMessageData *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_a8._M_head_impl);
      }
      local_c8.data_._0_4_ = 0x2a;
      iVar2 = internal::SooRep::size((SooRep *)&this_00->_impl_,(local_88.field_0._0_1_ & 4) == 0);
      if (iVar2 < 1) {
        failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                (0,(long)iVar2,"index < size()");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
                   ,0x32c,failure_msg);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)local_b0);
      }
      puVar3 = RepeatedField<unsigned_int>::elements
                         (&(this_00->_impl_).repeated_fixed32_,(local_88.field_0._0_1_ & 4) == 0);
      local_90.data_._0_4_ = *puVar3;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                ((internal *)&local_c0,"42","packed.repeated_fixed32(0)",(int *)&local_c8,
                 (uint *)&local_90);
      if (local_c0.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)local_b0);
        if (local_b8 == (LogMessageData *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = (pointer)(local_b8->entry).full_filename_._M_len;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
                   ,0x460,pcVar4);
        testing::internal::AssertHelper::operator=(&local_c8,(Message *)local_b0);
        testing::internal::AssertHelper::~AssertHelper(&local_c8);
        if ((long *)CONCAT71(local_b0._1_7_,local_b0[0]) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(local_b0._1_7_,local_b0[0]) + 8))();
        }
      }
      if (local_b8 != (LogMessageData *)0x0) {
        this_01 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_b8;
        __ptr_00._M_head_impl = local_b8;
LAB_00181168:
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()(this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             __ptr_00._M_head_impl);
      }
    }
  }
  else {
    this_01 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_b8;
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b0,(internal *)&local_c0,(AssertionResult *)0x2a5bc6,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x45e,(char *)CONCAT71(local_b0._1_7_,local_b0[0]));
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_b0._1_7_,local_b0[0]) != &local_a0) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_b0._1_7_,local_b0[0]),local_a0._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_c8.data_._4_4_,(int)local_c8.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_c8.data_._4_4_,(int)local_c8.data_) + 8))();
    }
    __ptr_00._M_head_impl = local_b8;
    if (local_b8 != (LogMessageData *)0x0) goto LAB_00181168;
  }
  proto2_unittest::PackedFixed32::~PackedFixed32(&local_88);
LAB_00181177:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
  }
  proto2_unittest::NonPackedFixed32::~NonPackedFixed32((NonPackedFixed32 *)local_40);
  return;
}

Assistant:

TYPED_TEST(LiteTest, AllLite47) {
  proto2_unittest::NonPackedFixed32 non_packed;
  non_packed.add_repeated_fixed32(42);
  std::string serialized;
  ASSERT_TRUE(non_packed.SerializeToString(&serialized));

  proto2_unittest::PackedFixed32 packed;
  ASSERT_TRUE(packed.ParseFromString(serialized));
  ASSERT_EQ(1, packed.repeated_fixed32_size());
  EXPECT_EQ(42, packed.repeated_fixed32(0));
}